

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeZone.cc
# Opt level: O1

time_t __thiscall muduo::TimeZone::fromLocalTime(TimeZone *this,tm *localTm)

{
  Data *data;
  undefined1 auVar1 [24];
  time_t tVar2;
  Localtime *pLVar3;
  tm tryTm;
  tm tmp;
  uint uStack_a4;
  tm local_a0;
  tm local_68;
  
  data = (this->data_).super___shared_ptr<muduo::TimeZone::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68.tm_zone = localTm->tm_zone;
  local_68.tm_sec = localTm->tm_sec;
  local_68.tm_min = localTm->tm_min;
  local_68.tm_hour = localTm->tm_hour;
  local_68.tm_mday = localTm->tm_mday;
  local_68.tm_mon = localTm->tm_mon;
  local_68.tm_year = localTm->tm_year;
  local_68.tm_wday = localTm->tm_wday;
  local_68.tm_yday = localTm->tm_yday;
  local_68.tm_isdst = localTm->tm_isdst;
  local_68._36_4_ = *(undefined4 *)&localTm->field_0x24;
  local_68.tm_gmtoff = localTm->tm_gmtoff;
  tVar2 = timegm(&local_68);
  auVar1._8_8_ = (ulong)uStack_a4 << 0x20;
  auVar1._0_8_ = tVar2;
  auVar1._16_8_ = 0;
  pLVar3 = detail::findLocaltime(data,(Transition)(auVar1 << 0x40),(Comp)0x0);
  if (localTm->tm_isdst != 0) {
    toLocalTime(&local_a0,this,tVar2 - pLVar3->gmtOffset);
    if (((local_a0.tm_isdst == 0) && (local_a0.tm_hour == localTm->tm_hour)) &&
       (local_a0.tm_min == localTm->tm_min)) {
      tVar2 = tVar2 + -0xe10;
    }
  }
  return tVar2 - pLVar3->gmtOffset;
}

Assistant:

time_t TimeZone::fromLocalTime(const struct tm& localTm) const
{
  assert(data_ != NULL);
  const Data& data(*data_);

  struct tm tmp = localTm;
  time_t seconds = ::timegm(&tmp); // FIXME: toUtcTime
  detail::Transition sentry(0, seconds, 0);
  const detail::Localtime* local = findLocaltime(data, sentry, detail::Comp(false));
  if (localTm.tm_isdst)
  {
    struct tm tryTm = toLocalTime(seconds - local->gmtOffset);
    if (!tryTm.tm_isdst
        && tryTm.tm_hour == localTm.tm_hour
        && tryTm.tm_min == localTm.tm_min)
    {
      // FIXME: HACK
      seconds -= 3600;
    }
  }
  return seconds - local->gmtOffset;
}